

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

int file_write(FILE *stream,void *buffer,size_t size)

{
  char *pcVar1;
  FILE *__stream;
  size_t sVar2;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  
  sVar2 = fwrite_unlocked(buffer,size,1,(FILE *)stream);
  __stream = _stderr;
  pcVar1 = argv0;
  if ((size == 0) || (sVar2 == 1)) {
    fflush((FILE *)stream);
    iVar5 = 1;
  }
  else {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    iVar5 = 0;
    fprintf(__stream,"%s: failed writing %lu bytes: %s\n",pcVar1,size,pcVar4);
  }
  return iVar5;
}

Assistant:

int
file_write(
    FILE* stream,
    const void* buffer,
    size_t size)
{
    if (fwrite_unlocked(buffer, size, 1, stream) != 1 && size != 0) {
        fprintf(stderr, "%s: failed writing %lu bytes: %s\n",
            argv0, (long unsigned int)size, strerror(errno));
        return 0;
    }
    else {
        fflush(stream);
        return 1;
    }
}